

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetOutputLoad(Abc_Ntk_t *pNtk,int PoNum,float Rise,float Fall)

{
  float fVar1;
  int iVar2;
  Abc_ManTime_t *pAVar3;
  Abc_Time_t *pAVar4;
  int local_2c;
  int i;
  Abc_Time_t *pTime;
  float Fall_local;
  float Rise_local;
  int PoNum_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((-1 < PoNum) && (iVar2 = Abc_NtkCoNum(pNtk), PoNum < iVar2)) {
    if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
      pAVar3 = Abc_ManTimeStart(pNtk);
      pNtk->pManTime = pAVar3;
    }
    fVar1 = (pNtk->pManTime->tOutLoadDef).Rise;
    if ((((fVar1 != Rise) || (NAN(fVar1) || NAN(Rise))) ||
        (fVar1 = (pNtk->pManTime->tOutLoadDef).Fall, fVar1 != Fall)) || (NAN(fVar1) || NAN(Fall))) {
      if (pNtk->pManTime->tOutLoad == (Abc_Time_t *)0x0) {
        iVar2 = Abc_NtkCoNum(pNtk);
        pAVar4 = (Abc_Time_t *)calloc((long)iVar2,8);
        pNtk->pManTime->tOutLoad = pAVar4;
        for (local_2c = 0; iVar2 = Abc_NtkCoNum(pNtk), local_2c < iVar2; local_2c = local_2c + 1) {
          pNtk->pManTime->tOutLoad[local_2c] = pNtk->pManTime->tOutLoadDef;
        }
      }
      pAVar4 = pNtk->pManTime->tOutLoad + PoNum;
      pAVar4->Rise = Rise;
      pAVar4->Fall = Fall;
    }
    return;
  }
  __assert_fail("PoNum >= 0 && PoNum < Abc_NtkCoNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                ,0x135,"void Abc_NtkTimeSetOutputLoad(Abc_Ntk_t *, int, float, float)");
}

Assistant:

void Abc_NtkTimeSetOutputLoad( Abc_Ntk_t * pNtk, int PoNum, float Rise, float Fall )
{
    Abc_Time_t * pTime;
    assert( PoNum >= 0 && PoNum < Abc_NtkCoNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    if ( pNtk->pManTime->tOutLoadDef.Rise == Rise && pNtk->pManTime->tOutLoadDef.Fall == Fall )
        return;
    if ( pNtk->pManTime->tOutLoad == NULL )
    {
        int i;
        pNtk->pManTime->tOutLoad = ABC_CALLOC( Abc_Time_t, Abc_NtkCoNum(pNtk) );
        for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
            pNtk->pManTime->tOutLoad[i] = pNtk->pManTime->tOutLoadDef;
    }
    pTime = pNtk->pManTime->tOutLoad + PoNum;
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}